

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray
          (Extension *this,MessageLite *extendee,ExtensionSet *extension_set,int number,
          uint8_t *target,EpsCopyOutputStream *stream)

{
  code *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  bool bVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  const_reference pdVar7;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar8;
  const_reference plVar9;
  double *pdVar10;
  const_reference puVar11;
  ulong *puVar12;
  const_reference puVar13;
  ulong uVar14;
  const_reference pbVar15;
  const_reference pfVar16;
  const_reference piVar17;
  MessageLite *pMVar18;
  undefined8 *extraout_RAX;
  undefined8 *puVar19;
  uint8_t *puVar20;
  uint uVar21;
  ulong uVar22;
  double *ptr;
  byte *pbVar23;
  long lVar24;
  uint uVar25;
  string_view s;
  LogMessage local_40;
  
  if (this->is_repeated == true) {
    if (this->is_packed != true) {
      uVar21 = this->type - 0x13;
      uVar14 = (ulong)uVar21;
      if (0xed < (byte)uVar21) {
        puVar20 = (uint8_t *)
                  (*(code *)(&DAT_006b794c + *(int *)(&DAT_006b794c + (ulong)(this->type - 1) * 4)))
                            ((this->field_0).int64_t_value);
        return puVar20;
      }
      goto LAB_0040090b;
    }
    if (*(int *)(this->cached_size).int_ == 0) {
      return target;
    }
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar22 = (ulong)(number * 8 + 2);
    uVar14 = uVar22;
    if (0x7f < (uint)(number << 3)) goto LAB_00400915;
LAB_003ff0c5:
    *target = (byte)uVar22;
    target = target + 1;
    uVar21 = *(uint *)(this->cached_size).int_;
    uVar22 = (ulong)(int)uVar21;
    uVar14 = uVar22;
    if (0x7f < uVar21) {
      do {
        *target = (byte)uVar14 | 0x80;
        uVar22 = uVar14 >> 7;
        target = target + 1;
        bVar1 = 0x3fff < uVar14;
        uVar14 = uVar22;
      } while (bVar1);
    }
    *target = (byte)uVar22;
    if (0xed < (byte)(this->type - 0x13)) {
      ptr = (double *)(target + 1);
      switch(this->type) {
      case '\x01':
        goto switchD_003ff106_caseD_1;
      case '\x02':
        iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar4 < 1) {
          return (uint8_t *)ptr;
        }
        iVar4 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          pfVar16 = RepeatedField<float>::Get((RepeatedField<float> *)this->field_0,iVar4);
          *(float *)ptr = *pfVar16;
          ptr = (double *)((long)ptr + 4);
          iVar4 = iVar4 + 1;
          iVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar4 < iVar5);
        return (uint8_t *)ptr;
      case '\x03':
        iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar4 < 1) {
          return (uint8_t *)ptr;
        }
        iVar4 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          puVar12 = (ulong *)RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar4);
          uVar14 = *puVar12;
          uVar22 = uVar14;
          if (0x7f < uVar14) {
            do {
              *(byte *)ptr = (byte)uVar22 | 0x80;
              uVar14 = uVar22 >> 7;
              ptr = (double *)((long)ptr + 1);
              bVar1 = 0x3fff < uVar22;
              uVar22 = uVar14;
            } while (bVar1);
          }
          *(char *)ptr = (char)uVar14;
          ptr = (double *)((long)ptr + 1);
          iVar4 = iVar4 + 1;
          iVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar4 < iVar5);
        return (uint8_t *)ptr;
      case '\x04':
        iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar4 < 1) {
          return (uint8_t *)ptr;
        }
        iVar4 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          puVar13 = RepeatedField<unsigned_long>::Get
                              ((RepeatedField<unsigned_long> *)this->field_0,iVar4);
          uVar14 = *puVar13;
          uVar22 = uVar14;
          if (0x7f < uVar14) {
            do {
              *(byte *)ptr = (byte)uVar22 | 0x80;
              uVar14 = uVar22 >> 7;
              ptr = (double *)((long)ptr + 1);
              bVar1 = 0x3fff < uVar22;
              uVar22 = uVar14;
            } while (bVar1);
          }
          *(char *)ptr = (char)uVar14;
          ptr = (double *)((long)ptr + 1);
          iVar4 = iVar4 + 1;
          iVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar4 < iVar5);
        return (uint8_t *)ptr;
      case '\x05':
        iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar4 < 1) {
          return (uint8_t *)ptr;
        }
        iVar4 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          piVar17 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar4);
          uVar22 = (ulong)*piVar17;
          uVar14 = uVar22;
          if (0x7f < uVar22) {
            do {
              *(byte *)ptr = (byte)uVar14 | 0x80;
              uVar22 = uVar14 >> 7;
              ptr = (double *)((long)ptr + 1);
              bVar1 = 0x3fff < uVar14;
              uVar14 = uVar22;
            } while (bVar1);
          }
          *(char *)ptr = (char)uVar22;
          ptr = (double *)((long)ptr + 1);
          iVar4 = iVar4 + 1;
          iVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar4 < iVar5);
        return (uint8_t *)ptr;
      case '\x06':
        iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar4 < 1) {
          return (uint8_t *)ptr;
        }
        iVar4 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          pdVar10 = (double *)
                    RepeatedField<unsigned_long>::Get
                              ((RepeatedField<unsigned_long> *)this->field_0,iVar4);
          *ptr = *pdVar10;
          ptr = ptr + 1;
          iVar4 = iVar4 + 1;
          iVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar4 < iVar5);
        return (uint8_t *)ptr;
      case '\a':
        iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar4 < 1) {
          return (uint8_t *)ptr;
        }
        iVar4 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          puVar11 = RepeatedField<unsigned_int>::Get
                              ((RepeatedField<unsigned_int> *)this->field_0,iVar4);
          *(uint *)ptr = *puVar11;
          ptr = (double *)((long)ptr + 4);
          iVar4 = iVar4 + 1;
          iVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar4 < iVar5);
        return (uint8_t *)ptr;
      case '\b':
        iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar4 < 1) {
          return (uint8_t *)ptr;
        }
        iVar4 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          pbVar15 = RepeatedField<bool>::Get((RepeatedField<bool> *)this->field_0,iVar4);
          *(bool *)ptr = *pbVar15;
          ptr = (double *)((long)ptr + 1);
          iVar4 = iVar4 + 1;
          iVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar4 < iVar5);
        return (uint8_t *)ptr;
      default:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x771);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (&local_40,(char (*) [37])"Non-primitive types can\'t be packed.");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_40);
      case '\r':
        iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar4 < 1) {
          return (uint8_t *)ptr;
        }
        iVar4 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          puVar11 = RepeatedField<unsigned_int>::Get
                              ((RepeatedField<unsigned_int> *)this->field_0,iVar4);
          uVar21 = *puVar11;
          uVar6 = uVar21;
          if (0x7f < uVar21) {
            do {
              *(byte *)ptr = (byte)uVar6 | 0x80;
              uVar21 = uVar6 >> 7;
              ptr = (double *)((long)ptr + 1);
              bVar1 = 0x3fff < uVar6;
              uVar6 = uVar21;
            } while (bVar1);
          }
          *(char *)ptr = (char)uVar21;
          ptr = (double *)((long)ptr + 1);
          iVar4 = iVar4 + 1;
          iVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar4 < iVar5);
        return (uint8_t *)ptr;
      case '\x0e':
        iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar4 < 1) {
          return (uint8_t *)ptr;
        }
        iVar4 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          piVar17 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar4);
          uVar22 = (ulong)*piVar17;
          uVar14 = uVar22;
          if (0x7f < uVar22) {
            do {
              *(byte *)ptr = (byte)uVar14 | 0x80;
              uVar22 = uVar14 >> 7;
              ptr = (double *)((long)ptr + 1);
              bVar1 = 0x3fff < uVar14;
              uVar14 = uVar22;
            } while (bVar1);
          }
          *(char *)ptr = (char)uVar22;
          ptr = (double *)((long)ptr + 1);
          iVar4 = iVar4 + 1;
          iVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar4 < iVar5);
        return (uint8_t *)ptr;
      case '\x0f':
        iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar4 < 1) {
          return (uint8_t *)ptr;
        }
        iVar4 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          piVar17 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar4);
          *(int *)ptr = *piVar17;
          ptr = (double *)((long)ptr + 4);
          iVar4 = iVar4 + 1;
          iVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar4 < iVar5);
        return (uint8_t *)ptr;
      case '\x10':
        iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar4 < 1) {
          return (uint8_t *)ptr;
        }
        iVar4 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          pdVar10 = (double *)RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar4);
          *ptr = *pdVar10;
          ptr = ptr + 1;
          iVar4 = iVar4 + 1;
          iVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar4 < iVar5);
        return (uint8_t *)ptr;
      case '\x11':
        iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar4 < 1) {
          return (uint8_t *)ptr;
        }
        iVar4 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          piVar17 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar4);
          uVar6 = *piVar17 >> 0x1f ^ *piVar17 * 2;
          uVar21 = uVar6;
          if (0x7f < uVar6) {
            do {
              *(byte *)ptr = (byte)uVar21 | 0x80;
              uVar6 = uVar21 >> 7;
              ptr = (double *)((long)ptr + 1);
              bVar1 = 0x3fff < uVar21;
              uVar21 = uVar6;
            } while (bVar1);
          }
          *(char *)ptr = (char)uVar6;
          ptr = (double *)((long)ptr + 1);
          iVar4 = iVar4 + 1;
          iVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar4 < iVar5);
        return (uint8_t *)ptr;
      case '\x12':
        iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar4 < 1) {
          return (uint8_t *)ptr;
        }
        iVar4 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          plVar9 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar4);
          uVar22 = *plVar9 >> 0x3f ^ *plVar9 * 2;
          uVar14 = uVar22;
          if (0x7f < uVar22) {
            do {
              *(byte *)ptr = (byte)uVar14 | 0x80;
              uVar22 = uVar14 >> 7;
              ptr = (double *)((long)ptr + 1);
              bVar1 = 0x3fff < uVar14;
              uVar14 = uVar22;
            } while (bVar1);
          }
          *(char *)ptr = (char)uVar22;
          ptr = (double *)((long)ptr + 1);
          iVar4 = iVar4 + 1;
          iVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar4 < iVar5);
        return (uint8_t *)ptr;
      }
    }
    InternalSerializeFieldWithCachedSizesToArray();
    puVar19 = extraout_RAX;
    goto LAB_00400974;
  }
  if ((this->field_0xa & 2) != 0) {
    return target;
  }
  uVar14 = (ulong)this->type;
  switch(this->type) {
  case '\x01':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    aVar8 = this->field_0;
    uVar14 = (ulong)(number * 8 + 1);
    if (0x7f < (uint)(number << 3)) {
      do {
        uVar21 = (uint)uVar14;
        *target = (byte)uVar14 | 0x80;
        uVar14 = uVar14 >> 7;
        target = target + 1;
      } while (0x3fff < uVar21);
    }
    *target = (byte)uVar14;
    *(anon_union_8_9_fdc4a54a_for_Extension_0 *)(target + 1) = aVar8;
    goto LAB_003ffe09;
  case '\x02':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar3 = (this->field_0).int32_t_value;
    uVar14 = (ulong)(number * 8 + 5);
    if (0x7f < (uint)(number << 3)) {
      do {
        uVar21 = (uint)uVar14;
        *target = (byte)uVar14 | 0x80;
        uVar14 = uVar14 >> 7;
        target = target + 1;
      } while (0x3fff < uVar21);
    }
    *target = (byte)uVar14;
    *(int32_t *)(target + 1) = iVar3;
    goto LAB_003fffc0;
  case '\x03':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar14 = (this->field_0).uint64_t_value;
    uVar6 = number << 3;
    uVar21 = uVar6;
    if (0x7f < uVar6) {
      do {
        *target = (byte)uVar21 | 0x80;
        uVar6 = uVar21 >> 7;
        target = target + 1;
        bVar1 = 0x3fff < uVar21;
        uVar21 = uVar6;
      } while (bVar1);
    }
    *target = (byte)uVar6;
    pbVar23 = target + 1;
    uVar22 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar23 = (byte)uVar22 | 0x80;
        uVar14 = uVar22 >> 7;
        pbVar23 = pbVar23 + 1;
        bVar1 = 0x3fff < uVar22;
        uVar22 = uVar14;
      } while (bVar1);
    }
    break;
  case '\x04':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar14 = (this->field_0).uint64_t_value;
    uVar6 = number << 3;
    uVar21 = uVar6;
    if (0x7f < uVar6) {
      do {
        *target = (byte)uVar21 | 0x80;
        uVar6 = uVar21 >> 7;
        target = target + 1;
        bVar1 = 0x3fff < uVar21;
        uVar21 = uVar6;
      } while (bVar1);
    }
    *target = (byte)uVar6;
    pbVar23 = target + 1;
    uVar22 = uVar14;
    if (0x7f < uVar14) {
      do {
        *pbVar23 = (byte)uVar22 | 0x80;
        uVar14 = uVar22 >> 7;
        pbVar23 = pbVar23 + 1;
        bVar1 = 0x3fff < uVar22;
        uVar22 = uVar14;
      } while (bVar1);
    }
    break;
  case '\x05':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    puVar20 = WireFormatLite::WriteInt32ToArray(number,(this->field_0).int32_t_value,target);
    return puVar20;
  case '\x06':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    aVar8 = this->field_0;
    uVar14 = (ulong)(number * 8 + 1);
    if (0x7f < (uint)(number << 3)) {
      do {
        uVar21 = (uint)uVar14;
        *target = (byte)uVar14 | 0x80;
        uVar14 = uVar14 >> 7;
        target = target + 1;
      } while (0x3fff < uVar21);
    }
    goto LAB_003ffe03;
  case '\a':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar3 = (this->field_0).int32_t_value;
    uVar14 = (ulong)(number * 8 + 5);
    if (0x7f < (uint)(number << 3)) {
      do {
        uVar21 = (uint)uVar14;
        *target = (byte)uVar14 | 0x80;
        uVar14 = uVar14 >> 7;
        target = target + 1;
      } while (0x3fff < uVar21);
    }
    goto LAB_003fffbb;
  case '\b':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0).bool_value;
    uVar6 = number << 3;
    uVar21 = uVar6;
    if (0x7f < uVar6) {
      do {
        *target = (byte)uVar21 | 0x80;
        uVar6 = uVar21 >> 7;
        target = target + 1;
        bVar2 = 0x3fff < uVar21;
        uVar21 = uVar6;
      } while (bVar2);
    }
    *target = (byte)uVar6;
    target[1] = bVar1;
    return target + 2;
  case '\t':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    puVar19 = *(undefined8 **)&(this->field_0).int32_t_value;
    this = (Extension *)puVar19[1];
    if ((long)this < 0x80) {
      uVar21 = number * 8;
      lVar24 = 1;
      if (((0x7f < uVar21) && (lVar24 = 2, 0x3fff < uVar21)) && (lVar24 = 3, 0x1fffff < uVar21)) {
        lVar24 = 5 - (ulong)(uVar21 < 0x10000000);
      }
      if ((long)this <= (long)(stream->end_ + ~(ulong)(target + lVar24) + 0x10)) {
        uVar25 = uVar21 | 2;
        uVar6 = uVar25;
        if (0x7f < uVar21) {
          do {
            *target = (byte)uVar6 | 0x80;
            uVar25 = uVar6 >> 7;
            target = target + 1;
            bVar1 = 0x3fff < uVar6;
            uVar6 = uVar25;
          } while (bVar1);
        }
LAB_0040015e:
        *target = (byte)uVar25;
        target[1] = (byte)this;
        memcpy(target + 2,(void *)*puVar19,(size_t)this);
        return target + (long)this + 2;
      }
    }
    goto LAB_00400974;
  case '\n':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    puVar20 = WireFormatLite::InternalWriteGroup(number,(MessageLite *)this->field_0,target,stream);
    return puVar20;
  case '\v':
    if ((this->field_0xa & 4) == 0) {
      aVar8 = this->field_0;
      iVar4 = MessageLite::GetCachedSize(aVar8);
      puVar20 = WireFormatLite::InternalWriteMessage
                          (number,(MessageLite *)aVar8,iVar4,target,stream);
      return puVar20;
    }
    pMVar18 = GetPrototypeForLazyMessage(extension_set,extendee,number);
    UNRECOVERED_JUMPTABLE = *(code **)(**(long **)&(this->field_0).int32_t_value + 0xa0);
    puVar20 = (uint8_t *)
              (*UNRECOVERED_JUMPTABLE)
                        (*(long **)&(this->field_0).int32_t_value,pMVar18,number,target,stream,
                         UNRECOVERED_JUMPTABLE);
    return puVar20;
  case '\f':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    puVar19 = *(undefined8 **)&(this->field_0).int32_t_value;
    this = (Extension *)puVar19[1];
    if ((long)this < 0x80) {
      uVar21 = number * 8;
      lVar24 = 1;
      if (((0x7f < uVar21) && (lVar24 = 2, 0x3fff < uVar21)) && (lVar24 = 3, 0x1fffff < uVar21)) {
        lVar24 = 5 - (ulong)(uVar21 < 0x10000000);
      }
      if ((long)this <= (long)(stream->end_ + ~(ulong)(target + lVar24) + 0x10)) {
        uVar25 = uVar21 | 2;
        uVar6 = uVar25;
        if (0x7f < uVar21) {
          do {
            *target = (byte)uVar6 | 0x80;
            uVar25 = uVar6 >> 7;
            target = target + 1;
            bVar1 = 0x3fff < uVar6;
            uVar6 = uVar25;
          } while (bVar1);
        }
        goto LAB_0040015e;
      }
    }
LAB_00400974:
    s._M_str = (char *)*puVar19;
    s._M_len = (size_t)this;
    puVar20 = io::EpsCopyOutputStream::WriteStringOutline(stream,number,s,target);
    return puVar20;
  case '\r':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar21 = (this->field_0).uint32_t_value;
    uVar25 = number << 3;
    uVar6 = uVar25;
    if (0x7f < uVar25) {
      do {
        *target = (byte)uVar6 | 0x80;
        uVar25 = uVar6 >> 7;
        target = target + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar25;
      } while (bVar1);
    }
    *target = (byte)uVar25;
    pbVar23 = target + 1;
    uVar6 = uVar21;
    if (0x7f < uVar21) {
      do {
        *pbVar23 = (byte)uVar6 | 0x80;
        uVar21 = uVar6 >> 7;
        pbVar23 = pbVar23 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar21;
      } while (bVar1);
    }
    *pbVar23 = (byte)uVar21;
    goto LAB_003ffa93;
  case '\x0e':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    puVar20 = WireFormatLite::WriteEnumToArray(number,(this->field_0).enum_value,target);
    return puVar20;
  case '\x0f':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar3 = (this->field_0).int32_t_value;
    uVar14 = (ulong)(number * 8 + 5);
    if (0x7f < (uint)(number << 3)) {
      do {
        uVar21 = (uint)uVar14;
        *target = (byte)uVar14 | 0x80;
        uVar14 = uVar14 >> 7;
        target = target + 1;
      } while (0x3fff < uVar21);
    }
LAB_003fffbb:
    *target = (byte)uVar14;
    *(int32_t *)(target + 1) = iVar3;
LAB_003fffc0:
    return target + 5;
  case '\x10':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    aVar8 = this->field_0;
    uVar14 = (ulong)(number * 8 + 1);
    if (0x7f < (uint)(number << 3)) {
      do {
        uVar21 = (uint)uVar14;
        *target = (byte)uVar14 | 0x80;
        uVar14 = uVar14 >> 7;
        target = target + 1;
      } while (0x3fff < uVar21);
    }
LAB_003ffe03:
    *target = (byte)uVar14;
    *(anon_union_8_9_fdc4a54a_for_Extension_0 *)(target + 1) = aVar8;
LAB_003ffe09:
    return target + 9;
  case '\x11':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    puVar20 = WireFormatLite::WriteSInt32ToArray(number,(this->field_0).int32_t_value,target);
    return puVar20;
  case '\x12':
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    puVar20 = WireFormatLite::WriteSInt64ToArray(number,(this->field_0).int64_t_value,target);
    return puVar20;
  default:
    InternalSerializeFieldWithCachedSizesToArray();
LAB_0040090b:
    InternalSerializeFieldWithCachedSizesToArray();
LAB_00400915:
    uVar22 = uVar14 & 0xffffffff;
    do {
      uVar21 = (uint)uVar14;
      *target = (byte)uVar14 | 0x80;
      uVar22 = uVar22 >> 7;
      target = target + 1;
      uVar14 = uVar22;
    } while (0x3fff < uVar21);
    goto LAB_003ff0c5;
  }
  *pbVar23 = (byte)uVar14;
LAB_003ffa93:
  return pbVar23 + 1;
switchD_003ff106_caseD_1:
  iVar4 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                       (undefined1  [16])
                       ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                       (undefined1  [16])0x4) == (undefined1  [16])0x0);
  if (iVar4 < 1) {
    return (uint8_t *)ptr;
  }
  iVar4 = 0;
  do {
    if (stream->end_ <= ptr) {
      ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
    }
    pdVar7 = RepeatedField<double>::Get((RepeatedField<double> *)this->field_0,iVar4);
    *ptr = *pdVar7;
    ptr = ptr + 1;
    iVar4 = iVar4 + 1;
    iVar5 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
  } while (iVar4 < iVar5);
  return (uint8_t *)ptr;
}

Assistant:

uint8_t* ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray(
    const MessageLite* extendee, const ExtensionSet* extension_set, int number,
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  if (is_repeated) {
    if (is_packed) {
      if (cached_size() == 0) return target;

      target = stream->EnsureSpace(target);
      target = WireFormatLite::WriteTagToArray(
          number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, target);
      target = WireFormatLite::WriteInt32NoTagToArray(cached_size(), target);

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      target = stream->EnsureSpace(target);                              \
      target = WireFormatLite::Write##CAMELCASE##NoTagToArray(           \
          ptr.repeated_##LOWERCASE##_value->Get(i), target);             \
    }                                                                    \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          ABSL_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }
    } else {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      target = stream->EnsureSpace(target);                              \
      target = WireFormatLite::Write##CAMELCASE##ToArray(                \
          number, ptr.repeated_##LOWERCASE##_value->Get(i), target);     \
    }                                                                    \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      target = stream->EnsureSpace(target);                              \
      target = stream->WriteString(                                      \
          number, ptr.repeated_##LOWERCASE##_value->Get(i), target);     \
    }                                                                    \
    break
        HANDLE_TYPE(STRING, String, string);
        HANDLE_TYPE(BYTES, Bytes, string);
#undef HANDLE_TYPE
        case WireFormatLite::TYPE_GROUP:
          for (int i = 0; i < ptr.repeated_message_value->size(); i++) {
            target = stream->EnsureSpace(target);
            target = WireFormatLite::InternalWriteGroup(
                number, ptr.repeated_message_value->Get(i), target, stream);
          }
          break;
        case WireFormatLite::TYPE_MESSAGE:
          for (int i = 0; i < ptr.repeated_message_value->size(); i++) {
            auto& msg = ptr.repeated_message_value->Get(i);
            target = WireFormatLite::InternalWriteMessage(
                number, msg, msg.GetCachedSize(), target, stream);
          }
          break;
      }
    }
  } else if (!is_cleared) {
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)                               \
  case WireFormatLite::TYPE_##UPPERCASE:                                       \
    target = stream->EnsureSpace(target);                                      \
    target = WireFormatLite::Write##CAMELCASE##ToArray(number, VALUE, target); \
    break

      HANDLE_TYPE(INT32, Int32, int32_t_value);
      HANDLE_TYPE(INT64, Int64, int64_t_value);
      HANDLE_TYPE(UINT32, UInt32, uint32_t_value);
      HANDLE_TYPE(UINT64, UInt64, uint64_t_value);
      HANDLE_TYPE(SINT32, SInt32, int32_t_value);
      HANDLE_TYPE(SINT64, SInt64, int64_t_value);
      HANDLE_TYPE(FIXED32, Fixed32, uint32_t_value);
      HANDLE_TYPE(FIXED64, Fixed64, uint64_t_value);
      HANDLE_TYPE(SFIXED32, SFixed32, int32_t_value);
      HANDLE_TYPE(SFIXED64, SFixed64, int64_t_value);
      HANDLE_TYPE(FLOAT, Float, float_value);
      HANDLE_TYPE(DOUBLE, Double, double_value);
      HANDLE_TYPE(BOOL, Bool, bool_value);
      HANDLE_TYPE(ENUM, Enum, enum_value);
#undef HANDLE_TYPE
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)         \
  case WireFormatLite::TYPE_##UPPERCASE:                 \
    target = stream->EnsureSpace(target);                \
    target = stream->WriteString(number, VALUE, target); \
    break
      HANDLE_TYPE(STRING, String, *ptr.string_value);
      HANDLE_TYPE(BYTES, Bytes, *ptr.string_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_GROUP:
        target = stream->EnsureSpace(target);
        target = WireFormatLite::InternalWriteGroup(number, *ptr.message_value,
                                                    target, stream);
        break;
      case WireFormatLite::TYPE_MESSAGE:
        if (is_lazy) {
          const auto* prototype =
              extension_set->GetPrototypeForLazyMessage(extendee, number);
          target = ptr.lazymessage_value->WriteMessageToArray(prototype, number,
                                                              target, stream);
        } else {
          target = WireFormatLite::InternalWriteMessage(
              number, *ptr.message_value, ptr.message_value->GetCachedSize(),
              target, stream);
        }
        break;
    }
  }
  return target;
}